

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O1

errr finish_parse_profile(parser *p)

{
  ushort uVar1;
  undefined8 *puVar2;
  room_profile *prVar3;
  char *pcVar4;
  room_builder_conflict p_Var5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ulong uVar9;
  angband_constants *paVar10;
  long *plVar11;
  undefined8 *p_00;
  room_profile *prVar12;
  cave_profile *pcVar13;
  long lVar14;
  uint16_t uVar15;
  wchar_t wVar16;
  undefined8 *puVar17;
  cave_profile *pcVar18;
  size_t len;
  undefined8 *p_01;
  ulong uVar19;
  byte bVar20;
  
  bVar20 = 0;
  plVar11 = (long *)parser_priv(p);
  paVar10 = z_info;
  z_info->profile_max = 0;
  if (plVar11 != (long *)0x0) {
    uVar15 = paVar10->profile_max;
    do {
      uVar15 = uVar15 + 1;
      plVar11 = (long *)*plVar11;
    } while (plVar11 != (long *)0x0);
    paVar10->profile_max = uVar15;
  }
  cave_profiles = (cave_profile *)mem_zalloc((ulong)paVar10->profile_max << 7);
  uVar1 = z_info->profile_max;
  p_00 = (undefined8 *)parser_priv(p);
  uVar9 = (ulong)uVar1;
  pcVar13 = cave_profiles;
  while (cave_profiles = pcVar13, p_00 != (undefined8 *)0x0) {
    uVar19 = uVar9 - 1;
    puVar17 = p_00;
    pcVar18 = pcVar13 + uVar19;
    for (lVar14 = 0x10; lVar14 != 0; lVar14 = lVar14 + -1) {
      pcVar18->next = (cave_profile *)*puVar17;
      puVar17 = puVar17 + (ulong)bVar20 * -2 + 1;
      pcVar18 = (cave_profile *)((long)pcVar18 + (ulong)bVar20 * -0x10 + 8);
    }
    puVar17 = (undefined8 *)*p_00;
    pcVar18 = pcVar13 + uVar9;
    if ((long)(ulong)z_info->profile_max <= (long)uVar9) {
      pcVar18 = (cave_profile *)0x0;
    }
    pcVar13[uVar19].next = pcVar18;
    plVar11 = (long *)p_00[0xe];
    pcVar13[uVar19].n_room_profiles = L'\0';
    if (plVar11 == (long *)0x0) {
      prVar12 = (room_profile *)0x0;
    }
    else {
      len = 0;
      wVar16 = L'\0';
      do {
        wVar16 = wVar16 + L'\x01';
        plVar11 = (long *)*plVar11;
        len = len + 0x38;
      } while (plVar11 != (long *)0x0);
      pcVar13[uVar19].n_room_profiles = wVar16;
      prVar12 = (room_profile *)mem_zalloc(len);
      pcVar13 = cave_profiles;
      if (L'\0' < cave_profiles[uVar19].n_room_profiles) {
        lVar14 = 0;
        p_01 = (undefined8 *)p_00[0xe];
        prVar3 = prVar12;
        do {
          pcVar4 = (char *)p_01[1];
          p_Var5 = (room_builder_conflict)p_01[2];
          uVar6 = p_01[3];
          uVar7 = p_01[4];
          uVar8 = p_01[5];
          prVar3->next = (room_profile *)*p_01;
          prVar3->name = pcVar4;
          *(undefined8 *)&prVar3->cutoff = p_01[6];
          prVar3->width = (int)uVar7;
          prVar3->level = (int)((ulong)uVar7 >> 0x20);
          prVar3->pit = (_Bool)(char)uVar8;
          *(int3 *)&prVar3->field_0x29 = (int3)((ulong)uVar8 >> 8);
          prVar3->rarity = (int)((ulong)uVar8 >> 0x20);
          prVar3->builder = p_Var5;
          prVar3->rating = (int)uVar6;
          prVar3->height = (int)((ulong)uVar6 >> 0x20);
          if (prVar3->next != (room_profile *)0x0) {
            prVar3->next = prVar3 + 1;
          }
          puVar2 = (undefined8 *)*p_01;
          mem_free(p_01);
          lVar14 = lVar14 + 1;
          pcVar13 = cave_profiles;
          p_01 = puVar2;
          prVar3 = prVar3 + 1;
        } while (lVar14 < cave_profiles[uVar19].n_room_profiles);
      }
    }
    pcVar13[uVar19].room_profiles = prVar12;
    mem_free(p_00);
    p_00 = puVar17;
    uVar9 = uVar19;
    pcVar13 = cave_profiles;
  }
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_profile(struct parser *p) {
	struct cave_profile *n, *c = parser_priv(p);
	int num;

	/* Count the list */
	z_info->profile_max = 0;
	while (c) {
		z_info->profile_max++;
		c = c->next;
	}

	/* Allocate the array and copy the records to it */
	cave_profiles = mem_zalloc(z_info->profile_max * sizeof(*c));
	num = z_info->profile_max - 1;
	for (c = parser_priv(p); c; c = n) {
		/* Main record */
		memcpy(&cave_profiles[num], c, sizeof(*c));
		n = c->next;
		if (num < z_info->profile_max - 1) {
			cave_profiles[num].next = &cave_profiles[num + 1];
		} else {
			cave_profiles[num].next = NULL;
		}

		if (c->room_profiles) {
			struct room_profile *r_old = c->room_profiles;
			struct room_profile *r_new;
			int i;

			/* Count the room profiles */
			cave_profiles[num].n_room_profiles = 0;
			while (r_old) {
				++cave_profiles[num].n_room_profiles;
				r_old = r_old->next;
			}

			/* Now allocate the room profile array */
			r_new = mem_zalloc(cave_profiles[num].n_room_profiles
				* sizeof(*r_new));

			r_old = c->room_profiles;
			for (i = 0; i < cave_profiles[num].n_room_profiles; i++) {
				struct room_profile *r_temp = r_old;

				/* Copy from the linked list to the array */
				memcpy(&r_new[i], r_old, sizeof(*r_old));

				/* Set the next profile pointer correctly. */
				if (r_new[i].next) {
					r_new[i].next = &r_new[i + 1];
				}

				/* Tidy up and advance to the next profile. */
				r_old = r_old->next;
				mem_free(r_temp);
			}

			cave_profiles[num].room_profiles = r_new;
		} else {
			cave_profiles[num].n_room_profiles = 0;
			cave_profiles[num].room_profiles = NULL;
		}

		mem_free(c);
		num--;
	}

	parser_destroy(p);
	return 0;
}